

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm)

{
  BYTE *iend;
  int iVar1;
  BYTE *pBVar2;
  ulong uVar3;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  undefined4 extraout_var;
  U32 UVar4;
  BYTE *pBVar5;
  int iVar6;
  U32 UVar7;
  U32 UVar8;
  ulong uVar9;
  BYTE *ip;
  
  UVar4 = (params->ldmParams).enableLdm;
  iend = (BYTE *)((long)src + srcSize);
  uVar3 = 0xdfffffff;
  if (srcSize < 0xdfffffff) {
    uVar3 = srcSize;
  }
  if (srcSize < 0x20000000) {
    uVar3 = srcSize;
  }
  ip = iend + -0xdfffffff;
  if (srcSize >> 0x1d < 7) {
    ip = (BYTE *)src;
  }
  if (uVar3 != 0) {
    pBVar2 = (ms->window).nextSrc;
    if (pBVar2 == ip) {
      pBVar5 = (ms->window).dictBase;
      UVar7 = (ms->window).lowLimit;
      uVar9 = (ulong)(ms->window).dictLimit;
    }
    else {
      pBVar5 = (ms->window).base;
      uVar9 = (long)pBVar2 - (long)pBVar5;
      UVar7 = (ms->window).dictLimit;
      (ms->window).lowLimit = UVar7;
      UVar8 = (U32)uVar9;
      (ms->window).dictLimit = UVar8;
      (ms->window).dictBase = pBVar5;
      (ms->window).base = ip + -uVar9;
      if (UVar8 - UVar7 < 8) {
        (ms->window).lowLimit = UVar8;
        UVar7 = UVar8;
      }
    }
    pBVar2 = ip + uVar3;
    (ms->window).nextSrc = pBVar2;
    if ((pBVar5 + UVar7 < pBVar2) && (ip < pBVar5 + (uVar9 & 0xffffffff))) {
      UVar7 = (U32)((long)pBVar2 - (long)pBVar5);
      if ((long)(uVar9 & 0xffffffff) < (long)pBVar2 - (long)pBVar5) {
        UVar7 = (U32)uVar9;
      }
      (ms->window).lowLimit = UVar7;
    }
  }
  iVar1 = params->forceWindow;
  UVar7 = 0;
  iVar6 = (int)iend;
  if (iVar1 == 0) {
    UVar7 = iVar6 - *(int *)&(ms->window).base;
  }
  ms->loadedDictEnd = UVar7;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if (ls == (ldmState_t *)0x0 || UVar4 == 0) {
    if (uVar3 < 9) {
      return uVar3;
    }
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,ip,iend);
  }
  else {
    if (uVar3 != 0) {
      pBVar2 = (ls->window).nextSrc;
      if (pBVar2 == ip) {
        pBVar5 = (ls->window).dictBase;
        UVar4 = (ls->window).lowLimit;
        uVar9 = (ulong)(ls->window).dictLimit;
      }
      else {
        pBVar5 = (ls->window).base;
        uVar9 = (long)pBVar2 - (long)pBVar5;
        UVar4 = (ls->window).dictLimit;
        (ls->window).lowLimit = UVar4;
        UVar7 = (U32)uVar9;
        (ls->window).dictLimit = UVar7;
        (ls->window).dictBase = pBVar5;
        (ls->window).base = ip + -uVar9;
        if (UVar7 - UVar4 < 8) {
          (ls->window).lowLimit = UVar7;
          UVar4 = UVar7;
        }
      }
      pBVar2 = ip + uVar3;
      (ls->window).nextSrc = pBVar2;
      if ((pBVar5 + UVar4 < pBVar2) && (ip < pBVar5 + (uVar9 & 0xffffffff))) {
        UVar4 = (U32)((long)pBVar2 - (long)pBVar5);
        if ((long)(uVar9 & 0xffffffff) < (long)pBVar2 - (long)pBVar5) {
          UVar4 = (U32)uVar9;
        }
        (ls->window).lowLimit = UVar4;
      }
    }
    UVar4 = 0;
    if (iVar1 == 0) {
      UVar4 = iVar6 - *(int *)&(ls->window).base;
    }
    ls->loadedDictEnd = UVar4;
    if (uVar3 < 9) {
      return uVar3;
    }
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,ip,iend);
    ZSTD_ldm_fillHashTable(ls,ip,iend,&params->ldmParams);
  }
  uVar3 = (ulong)((params->cParams).strategy - ZSTD_fast);
  switch(uVar3) {
  case 0:
    ZSTD_fillHashTable(ms,iend,dtlm);
    uVar3 = extraout_RAX_02;
    break;
  case 1:
    ZSTD_fillDoubleHashTable(ms,iend,dtlm);
    uVar3 = extraout_RAX_03;
    break;
  case 2:
  case 3:
  case 4:
    if (ms->dedicatedDictSearch == 0) {
      if (params->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) {
        memset(ms->tagTable,0,2L << ((byte)(params->cParams).hashLog & 0x3f));
        ZSTD_row_update(ms,iend + -8);
        uVar3 = extraout_RAX_01;
      }
      else {
        UVar4 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
        uVar3 = CONCAT44(extraout_var,UVar4);
      }
    }
    else {
      ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend + -8);
      uVar3 = extraout_RAX_00;
    }
    break;
  case 5:
  case 6:
  case 7:
  case 8:
    ZSTD_updateTree(ms,iend + -8,iend);
    uVar3 = extraout_RAX;
  }
  ms->nextToUpdate = iVar6 - *(int *)&(ms->window).base;
  return uVar3;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm && ls != NULL;

    /* Assert that we the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 const maxDictSize = ZSTD_CURRENT_MAX - 1;
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict)
            assert(ZSTD_window_isEmpty(ls->window));
        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (loadLdmDict) {
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
    }

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    if (loadLdmDict)
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_urm_auto);
            if (params->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog) * sizeof(U16);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}